

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::destroyNullHandleSwapchainTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  undefined1 *this;
  VkInstance pVVar1;
  VkDevice device;
  RefData<vk::Handle<(vk::HandleType)25>_> data;
  Type TVar2;
  VkInstance_s **ppVVar3;
  Display *nativeDisplay;
  Window *nativeWindow;
  Handle<(vk::HandleType)25> *pHVar4;
  VkDevice_s **ppVVar5;
  VkAllocationCallbacks *pVVar6;
  size_t sVar7;
  allocator<char> local_829;
  string local_828;
  uint local_808;
  allocator<char> local_801;
  string local_800;
  VkSwapchainKHR local_7e0;
  undefined1 local_7d8 [8];
  AllocationCallbackRecorder recordingAllocator;
  VkSwapchainKHR local_770;
  VkSwapchainKHR nullHandle;
  undefined1 local_760 [8];
  DeviceHelper devHelper;
  RefData<vk::Handle<(vk::HandleType)25>_> local_258;
  undefined1 local_238 [8];
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  Maybe<tcu::Vector<unsigned_int,_2>_> local_208;
  undefined1 local_1f8 [8];
  NativeObjects native;
  InstanceHelper instHelper;
  Type wsiType_local;
  Context *context_local;
  
  this = &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
          m_data.field_0x8;
  instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._4_4_ = wsiType;
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)this,context,wsiType,(VkAllocationCallbacks *)0x0);
  TVar2 = instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._4_4_;
  tcu::nothing<tcu::Vector<unsigned_int,2>>();
  NativeObjects::NativeObjects
            ((NativeObjects *)local_1f8,context,(Extensions *)this,TVar2,&local_208);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe(&local_208);
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  TVar2 = instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._4_4_;
  pVVar1 = *ppVVar3;
  nativeDisplay =
       de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::operator*
                 ((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_1f8);
  nativeWindow = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
                 operator*((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
                           &native.display.
                            super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>
                            .m_data.field_0x8);
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper.queue,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             pVVar1,TVar2,nativeDisplay,nativeWindow,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_258,(Move *)&devHelper.queue);
  data.deleter.m_instanceIface = local_258.deleter.m_instanceIface;
  data.object.m_internal = local_258.object.m_internal;
  data.deleter.m_instance = local_258.deleter.m_instance;
  data.deleter.m_allocator = local_258.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_238,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper.queue);
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar1 = *ppVVar3;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_238);
  nullHandle.m_internal = pHVar4->m_internal;
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_760,context,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             pVVar1,(VkSurfaceKHR)nullHandle.m_internal,(VkAllocationCallbacks *)0x0);
  ::vk::Handle<(vk::HandleType)26>::Handle(&local_770,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)&devHelper.queueFamilyIndex);
  recordingAllocator.m_records.m_last = (Block *)local_770.m_internal;
  ::vk::DeviceDriver::destroySwapchainKHR
            ((DeviceDriver *)
             &devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,*ppVVar5,
             local_770,(VkAllocationCallbacks *)0x0);
  pVVar6 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_7d8,pVVar6,1);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                      ((RefBase<vk::VkDevice_s_*> *)&devHelper.queueFamilyIndex);
  device = *ppVVar5;
  local_7e0.m_internal = local_770.m_internal;
  pVVar6 = ::vk::AllocationCallbacks::getCallbacks((AllocationCallbacks *)local_7d8);
  ::vk::DeviceDriver::destroySwapchainKHR
            ((DeviceDriver *)
             &devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator,device,
             local_7e0,pVVar6);
  sVar7 = ::vk::AllocationCallbackRecorder::getNumRecords((AllocationCallbackRecorder *)local_7d8);
  if (sVar7 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_800,"Implementation allocated/freed the memory",&local_801);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_800);
    std::__cxx11::string::~string((string *)&local_800);
    std::allocator<char>::~allocator(&local_801);
  }
  local_808 = (uint)(sVar7 != 0);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_7d8);
  if (local_808 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"Destroying a VK_NULL_HANDLE surface has no effect",&local_829);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_828);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
    local_808 = 1;
  }
  DeviceHelper::~DeviceHelper((DeviceHelper *)local_760);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_238);
  NativeObjects::~NativeObjects((NativeObjects *)local_1f8);
  InstanceHelper::~InstanceHelper
            ((InstanceHelper *)
             &native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus destroyNullHandleSwapchainTest (Context& context, Type wsiType)
{
	const InstanceHelper		instHelper	(context, wsiType);
	const NativeObjects			native		(context, instHelper.supportedExtensions, wsiType);
	const Unique<VkSurfaceKHR>	surface		(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper			devHelper	(context, instHelper.vki, *instHelper.instance, *surface);
	const VkSwapchainKHR		nullHandle	= DE_NULL;

	// Default allocator
	devHelper.vkd.destroySwapchainKHR(*devHelper.device, nullHandle, DE_NULL);

	// Custom allocator
	{
		AllocationCallbackRecorder	recordingAllocator	(getSystemAllocator(), 1u);

		devHelper.vkd.destroySwapchainKHR(*devHelper.device, nullHandle, recordingAllocator.getCallbacks());

		if (recordingAllocator.getNumRecords() != 0u)
			return tcu::TestStatus::fail("Implementation allocated/freed the memory");
	}

	return tcu::TestStatus::pass("Destroying a VK_NULL_HANDLE surface has no effect");
}